

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O2

BPropEntry * narrow_bpc_get(jit_State *J,IRRef1 key,IRRef mode)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x80) {
      return (BPropEntry *)0x0;
    }
    if (((*(IRRef1 *)((long)&J->bpropcache[0].key + lVar2) == key) &&
        (uVar1 = *(uint *)((long)&J->bpropcache[0].mode + lVar2), mode <= uVar1)) &&
       (((uVar1 ^ mode) & 0xfff) == 0)) break;
    lVar2 = lVar2 + 8;
  }
  return (BPropEntry *)((long)&J->bpropcache[0].key + lVar2);
}

Assistant:

static BPropEntry *narrow_bpc_get(jit_State *J, IRRef1 key, IRRef mode)
{
  ptrdiff_t i;
  for (i = 0; i < BPROP_SLOTS; i++) {
    BPropEntry *bp = &J->bpropcache[i];
    /* Stronger checks are ok, too. */
    if (bp->key == key && bp->mode >= mode &&
	((bp->mode ^ mode) & IRCONV_MODEMASK) == 0)
      return bp;
  }
  return NULL;
}